

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

bool __thiscall Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsBool(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  _Bit_type *p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  DeadlyImportError *pDVar5;
  bool bVar6;
  string val;
  shared_ptr<const_Assimp::FIBoolValue> boolValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&val,pFVar1,pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIBoolValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)&boolValue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
  if (boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar1,pAttrIdx);
    std::__cxx11::string::string
              ((string *)&val,(char *)CONCAT44(extraout_var,iVar4),(allocator *)&local_68);
    bVar6 = std::operator==(&val,"false");
    if (!bVar6) {
      bVar3 = std::operator==(&val,"true");
      if (!bVar3) {
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Bool attribute value can contain \"false\" or \"true\" not the \""
                       ,&val);
        std::operator+(&local_68,&local_48,"\"");
        DeadlyImportError::DeadlyImportError(pDVar5,&local_68);
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar6 = !bVar6;
    std::__cxx11::string::~string((string *)&val);
  }
  else {
    p_Var2 = ((boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->value).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if ((ulong)((boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->value).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)((boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->value).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8
        != 1) {
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&val,"Invalid bool value",(allocator *)&local_68);
      DeadlyImportError::DeadlyImportError(pDVar5,&val);
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar6 = (bool)((byte)*p_Var2 & 1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar6;
}

Assistant:

bool X3DImporter::XML_ReadNode_GetAttrVal_AsBool(const int pAttrIdx)
{
    auto boolValue = std::dynamic_pointer_cast<const FIBoolValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (boolValue) {
        if (boolValue->value.size() == 1) {
            return boolValue->value.front();
        }
        throw DeadlyImportError("Invalid bool value");
    }
    else {
        std::string val(mReader->getAttributeValue(pAttrIdx));

        if(val == "false")
            return false;
        else if(val == "true")
            return true;
        else
            throw DeadlyImportError("Bool attribute value can contain \"false\" or \"true\" not the \"" + val + "\"");
    }
}